

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O2

bool __thiscall
libmatroska::KaxBlockGroup::AddFrame
          (KaxBlockGroup *this,KaxTrackEntry *track,uint64 timecode,DataBuffer *buffer,
          LacingType lacing)

{
  bool bVar1;
  KaxInternalBlock *this_00;
  
  this_00 = &libebml::GetChild<libmatroska::KaxBlock>(&this->super_EbmlMaster)->
             super_KaxInternalBlock;
  if (this->ParentCluster != (KaxCluster *)0x0) {
    KaxInternalBlock::SetParent(this_00,this->ParentCluster);
    this->ParentTrack = track;
    bVar1 = KaxInternalBlock::AddFrame(this_00,track,timecode,buffer,lacing,false);
    return bVar1;
  }
  __assert_fail("ParentCluster != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                ,0x2d4,
                "bool libmatroska::KaxBlockGroup::AddFrame(const KaxTrackEntry &, uint64, DataBuffer &, LacingType)"
               );
}

Assistant:

bool KaxBlockGroup::AddFrame(const KaxTrackEntry & track, uint64 timecode, DataBuffer & buffer, LacingType lacing)
{
  KaxBlock & theBlock = GetChild<KaxBlock>(*this);
  assert(ParentCluster != NULL);
  theBlock.SetParent(*ParentCluster);
  ParentTrack = &track;
  return theBlock.AddFrame(track, timecode, buffer, lacing);
}